

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontNonSym.cpp
# Opt level: O2

void __thiscall
TPZFrontNonSym<std::complex<float>_>::AddKel
          (TPZFrontNonSym<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *elmat,
          TPZVec<long> *destinationindex)

{
  _ComplexT _Var1;
  long lVar2;
  complex<float> *pcVar3;
  int iVar4;
  int iVar5;
  complex<float> *pcVar6;
  long lVar7;
  long lVar8;
  long row;
  long col;
  
  lVar2 = destinationindex->fNElements;
  row = 0;
  lVar7 = 0;
  if (0 < lVar2) {
    lVar7 = lVar2;
  }
  for (; row != lVar7; row = row + 1) {
    iVar4 = Local(this,destinationindex->fStore[row]);
    for (col = 0; lVar2 != col; col = col + 1) {
      iVar5 = Local(this,destinationindex->fStore[col]);
      pcVar6 = TPZFMatrix<std::complex<float>_>::operator()(elmat,row,col);
      lVar8 = (long)(this->super_TPZFront<std::complex<float>_>).fMaxFront * (long)iVar5;
      pcVar3 = (this->super_TPZFront<std::complex<float>_>).fData.fStore;
      _Var1 = pcVar3[lVar8 + iVar4]._M_value;
      pcVar3[lVar8 + iVar4]._M_value =
           CONCAT44((float)(_Var1 >> 0x20) + (float)(pcVar6->_M_value >> 0x20),
                    (float)_Var1 + (float)pcVar6->_M_value);
    }
  }
  return;
}

Assistant:

void TPZFrontNonSym<TVar>::AddKel(TPZFMatrix<TVar> &elmat, TPZVec<int64_t> &destinationindex)
{
    int64_t i, j, ilocal, jlocal, nel;
    nel = destinationindex.NElements();
    for(i=0;i<nel;i++){
        ilocal = this->Local(destinationindex[i]);
		for(j=0;j<nel;j++) {
            jlocal=this->Local(destinationindex[j]);
            this->Element(ilocal, jlocal)+=elmat(i,j);
        }
    }
}